

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

bool __thiscall
slang::ast::Expression::bindMembershipExpressions
          (Expression *this,ASTContext *context,TokenKind keyword,bool requireIntegral,
          bool unwrapUnpacked,bool allowTypeReferences,bool allowValueRange,
          ExpressionSyntax *valueExpr,
          span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions,
          SmallVectorBase<const_slang::ast::Expression_*> *results)

{
  Compilation *compilation;
  long lVar1;
  long lVar2;
  SourceRange opRange;
  TokenKind kind;
  SyntaxNode *pSVar3;
  bool bVar4;
  Expression *expr;
  Diagnostic *pDVar5;
  Type *pTVar6;
  Type *pTVar7;
  undefined7 in_register_00000009;
  undefined6 in_register_00000012;
  long lVar8;
  undefined1 auVar9 [8];
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  bitmask<slang::ast::ASTFlags> bVar10;
  undefined7 in_stack_00000009;
  Type *type;
  string_view keywordStr;
  optional<unsigned_int> valueWidth;
  anon_class_72_9_cf3fa5c1 checkType;
  undefined1 in_stack_ffffffffffffff3c [12];
  bool local_b2;
  bool local_b1;
  undefined1 local_b0 [8];
  SymbolIndex local_a8;
  TokenKind local_a2;
  bitmask<slang::ast::ASTFlags> local_a0;
  int local_98;
  undefined4 local_94;
  string_view local_90;
  _Optional_payload_base<unsigned_int> local_80;
  anon_class_72_9_cf3fa5c1 local_78;
  
  local_a8 = (SymbolIndex)CONCAT71(in_register_00000089,allowTypeReferences);
  local_94 = (undefined4)CONCAT71(in_register_00000009,requireIntegral);
  local_98 = (int)CONCAT62(in_register_00000012,keyword);
  kind = (TokenKind)context;
  local_a2 = kind;
  local_90 = parsing::LexerFacts::getTokenKindText(kind);
  bVar10.m_bits._0_4_ = (int)CONCAT71(in_register_00000081,unwrapUnpacked) << 0xf;
  bVar10.m_bits._4_4_ = 0;
  compilation = (Compilation *)**(undefined8 **)this;
  expr = create(compilation,(ExpressionSyntax *)CONCAT71(in_stack_00000009,allowValueRange),
                (ASTContext *)this,bVar10,(Type *)0x0);
  local_78.type = (Type **)expr;
  SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
            ((SmallVectorBase<slang::ast::Expression_const*> *)expressions._M_extent._M_extent_value
             ,(Expression **)&local_78);
  pTVar6 = (expr->type).ptr;
  local_a0.m_bits = (underlying_type)pTVar6;
  local_80 = (_Optional_payload_base<unsigned_int>)evalEffectiveWidth((ASTContext *)this,expr,kind);
  local_b2 = bad(expr);
  local_b1 = isImplicitString(expr);
  if (local_98 == 0) {
    bVar4 = Type::isAggregate(pTVar6);
    if (!bVar4) goto LAB_00428729;
  }
  else {
    bVar4 = Type::isIntegral(pTVar6);
    if (bVar4) goto LAB_00428729;
  }
  if (local_b2 == false) {
    pDVar5 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x270007,expr->sourceRange);
    pDVar5 = ast::operator<<(pDVar5,(Type *)local_a0.m_bits);
    Diagnostic::operator<<(pDVar5,local_90);
    local_b2 = true;
  }
LAB_00428729:
  local_78.type = (Type **)(local_b0 + 0x10);
  local_78.canBeStrings = &local_b1;
  local_78.keywordStr = &local_90;
  local_78.bad = &local_b2;
  local_78.keyword = (TokenKind *)(local_b0 + 0xe);
  local_78.valueWidth = (optional<unsigned_int> *)&local_80;
  local_78.comp = compilation;
  local_78.context = (ASTContext *)this;
  local_78.valueRes = expr;
  if (expressions._M_ptr != (pointer)0x0) {
    pSVar3 = &valueExpr->super_SyntaxNode;
    do {
      local_b0 = (undefined1  [8])
                 create(compilation,*(ExpressionSyntax **)valueExpr,(ASTContext *)this,bVar10,
                        (Type *)0x0);
      SmallVectorBase<slang::ast::Expression_const*>::
      emplace_back<slang::ast::Expression_const*const&>
                ((SmallVectorBase<slang::ast::Expression_const*> *)
                 expressions._M_extent._M_extent_value,(Expression **)local_b0);
      bVar4 = bad((Expression *)local_b0);
      local_b2 = (bool)(bVar4 | local_b2);
      if (local_b2 == false) {
        if (((undefined1)local_a8 == 0) ||
           (*(ExpressionKind *)(Compilation **)local_b0 != ValueRange)) {
          pTVar6 = (Type *)((string_view *)((long)local_b0 + 8))->_M_len;
          if ((char)local_98 == '\0') {
            if ((char)local_94 != '\0') {
              while (bVar4 = Type::isUnpackedArray(pTVar6), bVar4) {
                pTVar6 = Type::getArrayElementType(pTVar6);
              }
            }
            auVar9 = local_b0;
            if ((local_b1 == true) &&
               (bVar4 = isImplicitString((Expression *)local_b0), auVar9 = local_b0, !bVar4)) {
              pTVar7 = pTVar6->canonical;
              if (pTVar7 == (Type *)0x0) {
                Type::resolveCanonical(pTVar6);
                pTVar7 = pTVar6->canonical;
              }
              auVar9 = local_b0;
              if ((pTVar7->super_Symbol).kind != StringType) {
                local_b1 = false;
              }
            }
          }
          else {
            bVar4 = Type::isIntegral(pTVar6);
            auVar9 = local_b0;
            if (!bVar4) {
              pDVar5 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x270007,
                                           *(SourceRange *)((long)local_b0 + 0x20));
              pDVar5 = ast::operator<<(pDVar5,pTVar6);
              Diagnostic::operator<<(pDVar5,local_90);
              local_b2 = true;
              goto LAB_004288f7;
            }
          }
        }
        else {
          if ((local_b1 == true) && (bVar4 = isImplicitString((Expression *)local_b0), !bVar4)) {
            local_b1 = false;
          }
          auVar9 = local_b0;
          bindMembershipExpressions::anon_class_72_9_cf3fa5c1::operator()
                    (&local_78,(Expression *)((Scope *)((long)local_b0 + 0x38))->compilation,
                     (Type *)(((Symbol *)
                              &((Scope *)((long)local_b0 + 0x38))->compilation->super_BumpAllocator)
                             ->name)._M_len);
          if (*(int *)((long)auVar9 + 0x30) != 0) goto LAB_004288f7;
          auVar9 = (undefined1  [8])((Scope *)((long)auVar9 + 0x38))->thisSym;
          pTVar6 = (Type *)(((Symbol *)auVar9)->name)._M_len;
        }
        bindMembershipExpressions::anon_class_72_9_cf3fa5c1::operator()
                  (&local_78,(Expression *)auVar9,pTVar6);
      }
LAB_004288f7:
      valueExpr = (ExpressionSyntax *)((long)valueExpr + 8);
    } while (valueExpr != (ExpressionSyntax *)(&pSVar3->kind + (long)expressions._M_ptr * 2));
  }
  local_a8 = CONCAT31(local_a8._1_3_,local_b2);
  if ((local_b2 == false) &&
     (lVar1 = *(long *)(expressions._M_extent._M_extent_value + 8), lVar1 != 0)) {
    lVar2 = *(long *)expressions._M_extent._M_extent_value;
    lVar8 = 0;
    do {
      local_b0 = *(undefined1 (*) [8])(lVar2 + lVar8);
      bVar4 = Type::isNumeric((Type *)local_a0.m_bits);
      bVar10.m_bits = local_a0.m_bits;
      if (bVar4) {
LAB_0042896e:
        bVar4 = Type::isUnpackedArray
                          (((not_null<const_slang::ast::Type_*> *)((long)local_b0 + 8))->ptr);
        if (bVar4) goto LAB_00428980;
        opRange._4_12_ = in_stack_ffffffffffffff3c;
        opRange.startLoc._0_4_ = 1;
        contextDetermined(this,(ASTContext *)local_b0,(Expression **)0x0,
                          (Expression *)local_a0.m_bits,(Type *)0x0,opRange,Implicit);
      }
      else {
        pTVar6 = *(Type **)(local_a0.m_bits + 0x40);
        if (pTVar6 == (Type *)0x0) {
          Type::resolveCanonical((Type *)local_a0.m_bits);
          pTVar6 = *(Type **)(bVar10.m_bits + 0x40);
        }
        if ((pTVar6->super_Symbol).kind == StringType) goto LAB_0042896e;
LAB_00428980:
        selfDetermined((ASTContext *)this,(Expression **)local_b0);
      }
      *(undefined1 (*) [8])(*(long *)expressions._M_extent._M_extent_value + lVar8) = local_b0;
      lVar8 = lVar8 + 8;
    } while (lVar1 << 3 != lVar8);
  }
  return (bool)((undefined1)local_a8 ^ 1);
}

Assistant:

bool Expression::bindMembershipExpressions(const ASTContext& context, TokenKind keyword,
                                           bool requireIntegral, bool unwrapUnpacked,
                                           bool allowTypeReferences, bool allowValueRange,
                                           const ExpressionSyntax& valueExpr,
                                           std::span<const ExpressionSyntax* const> expressions,
                                           SmallVectorBase<const Expression*>& results) {
    const auto keywordStr = LexerFacts::getTokenKindText(keyword);
    auto extraFlags = allowTypeReferences ? ASTFlags::AllowTypeReferences : ASTFlags::None;
    Compilation& comp = context.getCompilation();
    Expression& valueRes = create(comp, valueExpr, context, extraFlags);
    results.push_back(&valueRes);

    const Type* type = valueRes.type;
    auto valueWidth = evalEffectiveWidth(context, valueRes, keyword);
    bool bad = valueRes.bad();
    bool canBeStrings = valueRes.isImplicitString();

    if ((!requireIntegral && type->isAggregate()) || (requireIntegral && !type->isIntegral())) {
        if (!bad) {
            context.addDiag(diag::BadSetMembershipType, valueRes.sourceRange)
                << *type << keywordStr;
            bad = true;
        }
    }

    auto checkType = [&](const Expression& expr, const Type& bt) {
        if (bt.isNumeric() && type->isNumeric()) {
            type = OpInfo::binaryType(comp, type, &bt, false);
        }
        else if ((bt.isClass() && bt.isAssignmentCompatible(*type)) ||
                 (type->isClass() && type->isAssignmentCompatible(bt))) {
            // ok
        }
        else if ((bt.isCHandle() || bt.isNull()) && (type->isCHandle() || type->isNull())) {
            // ok
        }
        else if ((bt.isEvent() || bt.isNull()) && (type->isEvent() || type->isNull())) {
            // ok
        }
        else if ((bt.isCovergroup() || bt.isNull()) && (type->isCovergroup() || type->isNull())) {
            // ok
        }
        else if (bt.isTypeRefType() && type->isTypeRefType()) {
            // ok
        }
        else if (bt.isUnbounded() && (type->isNumeric() || type->isString())) {
            // ok
        }
        else if (canBeStrings) {
            // If canBeStrings is still true, it means either this specific type or
            // the common type (or both) are of type string. This is ok, but force
            // all further expressions to also be strings (or implicitly
            // convertible to them).
            type = &comp.getStringType();
        }
        else if (bt.isAggregate()) {
            // Aggregates are just never allowed in membership expressions.
            context.addDiag(diag::BadSetMembershipType, expr.sourceRange) << bt << keywordStr;
            bad = true;
        }
        else {
            // Couldn't find a common type.
            context.addDiag(diag::NoCommonComparisonType, expr.sourceRange)
                << keywordStr << bt << *type;
            bad = true;
        }

        if (!bad && !bt.isMatching(*valueRes.type) && !bt.isUnbounded()) {
            auto& lct = bt.getCanonicalType();
            auto& rct = valueRes.type->getCanonicalType();
            BinaryExpression::analyzeOpTypes(lct, rct, bt, *valueRes.type, expr, valueRes, context,
                                             expr.sourceRange, diag::CaseTypeMismatch,
                                             /* isComparison */ false, keywordStr);

            if (expr.type->isIntegral() && valueRes.type->isIntegral()) {
                // Check whether either the item or the value expression is
                // a constant integral (but not both). If so, check that the
                // constant value's effective width is not larger than the
                // bit width of the other expression, which would make it
                // impossible to ever match.
                auto exprWidth = evalEffectiveWidth(context, expr, keyword);
                auto vw = valueWidth.value_or(valueRes.type->getBitWidth());

                if (valueWidth > expr.type->getBitWidth() && !exprWidth) {
                    auto& diag = context.addDiag(diag::CaseOutsideRange, expr.sourceRange);
                    diag << keywordStr << expr.type->getBitWidth() << *valueWidth;
                }
                else if (exprWidth > vw && !valueWidth) {
                    auto& diag = context.addDiag(diag::CaseOutsideRange, expr.sourceRange);
                    diag << keywordStr << *exprWidth << vw;
                }
            }
        }
    };

    // We need to find a common type across all expressions. If this is for a wildcard
    // case statement, the types can only be integral. Otherwise all singular types are allowed.
    for (auto expr : expressions) {
        Expression* bound = &create(comp, *expr, context, extraFlags);
        results.push_back(bound);
        bad |= bound->bad();
        if (bad)
            continue;

        // Special handling for value range expressions -- they don't have
        // a real type on their own, we need to check their bounds.
        if (allowValueRange && bound->kind == ExpressionKind::ValueRange) {
            if (canBeStrings && !bound->isImplicitString())
                canBeStrings = false;

            auto& range = bound->as<ValueRangeExpression>();
            checkType(range.left(), *range.left().type);
            if (range.rangeKind == ValueRangeKind::Simple)
                checkType(range.right(), *range.right().type);
            continue;
        }

        const Type* bt = bound->type;
        if (requireIntegral) {
            if (!bt->isIntegral()) {
                context.addDiag(diag::BadSetMembershipType, bound->sourceRange)
                    << *bt << keywordStr;
                bad = true;
            }
            else {
                checkType(*bound, *bt);
            }
            continue;
        }

        // If this is an "inside" operation, then unpacked arrays are unwrapped
        // into their element types before checking further.
        if (unwrapUnpacked) {
            while (bt->isUnpackedArray())
                bt = bt->getArrayElementType();
        }

        if (canBeStrings && !bound->isImplicitString() && !bt->isString())
            canBeStrings = false;

        checkType(*bound, *bt);
    }

    if (bad)
        return false;

    size_t index = 0;
    for (auto result : results) {
        // const_casts here are because we want the result array to be constant and
        // don't want to waste time / space allocating another array here locally just
        // to immediately copy it to the output.
        Expression* expr = const_cast<Expression*>(result);

        if ((type->isNumeric() || type->isString()) && !expr->type->isUnpackedArray())
            contextDetermined(context, expr, nullptr, *type, {});
        else
            selfDetermined(context, expr);

        SLANG_ASSERT(!expr->bad());
        results[index++] = expr;
    }

    return true;
}